

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O3

void __thiscall r_exec::PTPX::reduce(PTPX *this,View *input)

{
  list<r_exec::Input> *destination;
  atomic_int_fast64_t *paVar1;
  Code *new_cst_00;
  bool bVar2;
  short sVar3;
  int iVar4;
  Code *object;
  BindingMap *this_00;
  undefined4 extraout_var;
  uint64_t uVar5;
  uint64_t uVar6;
  TimingGuardBuilder *this_01;
  _Fact *f_icst;
  undefined4 extraout_var_00;
  long *plVar7;
  Code *pCVar8;
  undefined4 extraout_var_01;
  pointer pcVar9;
  TimingGuardBuilder *guard_builder;
  list<r_exec::Input> *s;
  TimingGuardBuilder *in_R8;
  uint64_t in_R9;
  _Object *p_Var10;
  const_iterator cVar11;
  uint16_t cause_index;
  Input cause;
  Code *new_cst;
  const_iterator local_98;
  Code *local_88;
  PTPX *local_80;
  ushort local_72;
  BindingMap *local_70;
  uint64_t local_68;
  long *local_60;
  _Object *local_58;
  _Object *local_50;
  char local_48;
  uint64_t local_40;
  Code *local_38;
  
  destination = &(this->super__TPX).inputs;
  s = destination;
  AutoFocusController::copy_cross_buffer((this->super__TPX).super_TPX.auto_focus,destination);
  local_68 = (*Now)();
  object = (Code *)Fact::operator_new((Fact *)0x150,(size_t)s);
  local_80 = this;
  Fact::Fact((Fact *)object,(Fact *)(this->f_imdl).object);
  _Fact::set_opposite((_Fact *)object);
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_88 = BindingMap::abstract_object(this_00,object,false);
  if (local_88 != (Code *)0x0) {
    LOCK();
    paVar1 = &(local_88->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_98.super__iterator._cell = (local_80->super__TPX).inputs.used_cells_head;
  cVar11._list = destination;
  cVar11.super__iterator._cell = local_98.super__iterator._cell;
  local_98._list = destination;
  local_70 = this_00;
  if (local_98.super__iterator._cell != -1) {
    do {
      p_Var10 = ((cVar11._list)->cells).
                super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                ._M_impl.super__Vector_impl_data._M_start[cVar11.super__iterator._cell._cell].data.
                input.object;
      (*p_Var10->_vptr__Object[4])(p_Var10,0);
      sVar3 = r_code::Atom::asOpcode();
      if (sVar3 == Opcodes::Cmd) {
        cVar11 = r_code::list<r_exec::Input>::erase(destination,&local_98);
LAB_0019304c:
        local_98._list = cVar11._list;
      }
      else {
        bVar2 = BindingMap::intersect
                          (local_70,*(BindingMap **)
                                     &((local_98._list)->cells).
                                      super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [local_98.super__iterator._cell].data.bindings);
        if (!bVar2) {
LAB_00193041:
          cVar11 = r_code::list<r_exec::Input>::erase(destination,&local_98);
          goto LAB_0019304c;
        }
        uVar5 = _Fact::get_after((_Fact *)((local_98._list)->cells).
                                          super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                                          ._M_impl.super__Vector_impl_data._M_start
                                          [local_98.super__iterator._cell].data.input.object);
        uVar6 = _Fact::get_after((_Fact *)object);
        if (uVar6 <= uVar5) goto LAB_00193041;
        cVar11._list = local_98._list;
        cVar11.super__iterator._cell =
             ((local_98._list)->cells).
             super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start[local_98.super__iterator._cell].next;
      }
      local_98.super__iterator = cVar11.super__iterator._cell;
    } while (local_98.super__iterator._cell != -1);
    local_98.super__iterator._cell = (local_80->super__TPX).inputs.used_cells_head;
    local_98._list = destination;
    if (local_98.super__iterator._cell != -1) {
      pcVar9 = (destination->cells).
               super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
      guard_builder = (TimingGuardBuilder *)0x0;
      do {
        p_Var10 = pcVar9[local_98.super__iterator._cell].data.input.object;
        iVar4 = (*p_Var10->_vptr__Object[9])(p_Var10,0);
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                  ((long *)CONCAT44(extraout_var,iVar4),0);
        sVar3 = r_code::Atom::asOpcode();
        if (sVar3 != Opcodes::ICst) {
          pcVar9 = ((local_98._list)->cells).
                   super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_60 = *(long **)&pcVar9[local_98.super__iterator._cell].data.bindings;
          if (local_60 != (long *)0x0) {
            LOCK();
            local_60[1] = local_60[1] + 1;
            UNLOCK();
          }
          local_58 = pcVar9[local_98.super__iterator._cell].data.abstraction.object;
          if (local_58 != (_Object *)0x0) {
            LOCK();
            (local_58->refCount).super___atomic_base<long>._M_i =
                 (local_58->refCount).super___atomic_base<long>._M_i + 1;
            UNLOCK();
          }
          local_50 = pcVar9[local_98.super__iterator._cell].data.input.object;
          if (local_50 != (_Object *)0x0) {
            LOCK();
            (local_50->refCount).super___atomic_base<long> =
                 (__atomic_base<long>)
                 (((__int_type)(local_50->refCount).super___atomic_base<long>)._M_i + 1);
            UNLOCK();
          }
          local_48 = pcVar9[local_98.super__iterator._cell].data.eligible_cause;
          local_40 = pcVar9[local_98.super__iterator._cell].data.ijt;
          if ((bool)local_48 == true) {
            uVar5 = _Fact::get_after((_Fact *)object);
            p_Var10 = local_50;
            uVar6 = _Fact::get_after((_Fact *)local_50);
            this_01 = (TimingGuardBuilder *)operator_new(0x18);
            TimingGuardBuilder::TimingGuardBuilder(this_01,uVar5 - uVar6);
            if (guard_builder != this_01) {
              if (guard_builder != (TimingGuardBuilder *)0x0) {
                LOCK();
                paVar1 = &(guard_builder->super_GuardBuilder).super__Object.refCount;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if ((guard_builder->super_GuardBuilder).super__Object.refCount.
                    super___atomic_base<long>._M_i < 1) {
                  (*(guard_builder->super_GuardBuilder).super__Object._vptr__Object[1])
                            (guard_builder);
                }
              }
              LOCK();
              paVar1 = &(this_01->super_GuardBuilder).super__Object.refCount;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + 1;
              UNLOCK();
              guard_builder = this_01;
              p_Var10 = local_50;
            }
            f_icst = _TPX::find_f_icst(&local_80->super__TPX,(_Fact *)p_Var10,&local_72,&local_38);
            new_cst_00 = local_38;
            if (f_icst == (_Fact *)0x0) {
              bVar2 = build_mdl(local_80,(_Fact *)p_Var10,(_Fact *)object,
                                &guard_builder->super_GuardBuilder,(uint64_t)in_R8);
              if (bVar2) {
                _TPX::inject_hlps(&local_80->super__TPX,local_68);
              }
            }
            else {
              pCVar8 = local_38;
              if (local_38 == (Code *)0x0) {
                iVar4 = (*(f_icst->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                          super_LObject.super_Code.super__Object._vptr__Object[9])(f_icst,0);
                plVar7 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x48))
                                           ((long *)CONCAT44(extraout_var_00,iVar4),0);
                sVar3 = (**(code **)(*plVar7 + 0x50))(plVar7);
                pCVar8 = (Code *)(**(code **)(*plVar7 + 0x48))(plVar7,sVar3 + -1);
              }
              iVar4 = (*(pCVar8->super__Object)._vptr__Object[9])(pCVar8,(ulong)local_72);
              in_R8 = guard_builder;
              bVar2 = build_mdl(local_80,f_icst,(_Fact *)CONCAT44(extraout_var_01,iVar4),
                                (_Fact *)object,&guard_builder->super_GuardBuilder,in_R9,new_cst_00)
              ;
              if (bVar2) {
                _TPX::inject_hlps(&local_80->super__TPX,local_68);
              }
            }
          }
          if (local_50 != (_Object *)0x0) {
            LOCK();
            (local_50->refCount).super___atomic_base<long> =
                 (__atomic_base<long>)
                 (((__int_type)(local_50->refCount).super___atomic_base<long>)._M_i + -1);
            UNLOCK();
            if (((__int_type)(local_50->refCount).super___atomic_base<long>)._M_i < 1) {
              (*local_50->_vptr__Object[1])();
            }
          }
          if (local_58 != (_Object *)0x0) {
            LOCK();
            (local_58->refCount).super___atomic_base<long>._M_i =
                 (local_58->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if ((local_58->refCount).super___atomic_base<long>._M_i < 1) {
              (*local_58->_vptr__Object[1])();
            }
          }
          if (local_60 != (long *)0x0) {
            LOCK();
            local_60[1] = local_60[1] + -1;
            UNLOCK();
            if (local_60[1] < 1) {
              (**(code **)(*local_60 + 8))();
            }
          }
        }
        pcVar9 = ((local_98._list)->cells).
                 super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_98.super__iterator._cell = pcVar9[local_98.super__iterator._cell].next;
      } while (local_98.super__iterator._cell != -1);
      if (guard_builder != (TimingGuardBuilder *)0x0) {
        LOCK();
        paVar1 = &(guard_builder->super_GuardBuilder).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((guard_builder->super_GuardBuilder).super__Object.refCount.super___atomic_base<long>.
            _M_i < 1) {
          (*(guard_builder->super_GuardBuilder).super__Object._vptr__Object[1])(guard_builder);
        }
      }
    }
  }
  if (local_88 != (Code *)0x0) {
    LOCK();
    paVar1 = &(local_88->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if ((local_88->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
      (*(local_88->super__Object)._vptr__Object[1])();
    }
  }
  LOCK();
  paVar1 = &(local_70->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  if ((local_70->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
    (*(local_70->super__Object)._vptr__Object[1])();
  }
  return;
}

Assistant:

void PTPX::reduce(r_exec::View *input)
{
    auto_focus->copy_cross_buffer(inputs); // the cause of the prediction failure comes before the prediction.
    uint64_t analysis_starting_time = Now();
    _Fact *consequent = new Fact((Fact *)f_imdl); // input->object is the prediction failure: ignore and consider |f->imdl instead.
    consequent->set_opposite();
    P<BindingMap> end_bm = new BindingMap();
    P<_Fact> abstract_input = (_Fact *)end_bm->abstract_object(consequent, false);
    r_code::list<Input>::const_iterator i;

    for (i = inputs.begin(); i != inputs.end();) { // filter out inputs irrelevant for the prediction.
        if (i->input->code(0).asOpcode() == Opcodes::Cmd) { // no cmds as req lhs (because no bwd-operational); prefer: cmd->effect, effect->imdl.
            i = inputs.erase(i);
        } else if (!end_bm->intersect(i->bindings) || // discard inputs that do not share values with the consequent.
                   i->input->get_after() >= consequent->get_after()) { // discard inputs younger than the consequent.
            i = inputs.erase(i);
        } else {
            ++i;
        }
    }

    P<GuardBuilder> guard_builder;
    uint64_t period;

    for (i = inputs.begin(); i != inputs.end(); ++i) {
        if (i->input->get_reference(0)->code(0).asOpcode() == Opcodes::ICst) {
            continue;    // components will be evaluated first, then the icst will be identified.
        }

        Input cause = *i;

        if (!cause.eligible_cause) {
            continue;
        }

        period = consequent->get_after() - cause.input->get_after();
        guard_builder = new TimingGuardBuilder(period); // TODO: use the durations.
        uint16_t cause_index;
        Code *new_cst;
        _Fact *f_icst = find_f_icst(cause.input, cause_index, new_cst);

        if (f_icst == nullptr) {
            if (build_mdl(cause.input, consequent, guard_builder, period)) {
                inject_hlps(analysis_starting_time);
            }
        } else {
            Code *unpacked_cst;

            if (new_cst == nullptr) {
                Code *cst = f_icst->get_reference(0)->get_reference(0);
                unpacked_cst = cst->get_reference(cst->references_size() - CST_HIDDEN_REFS); // the cst is packed, retrieve the pattern from the unpacked code.
            } else {
                unpacked_cst = new_cst;
            }

            _Fact *cause_pattern = (_Fact *)unpacked_cst->get_reference(cause_index);

            if (build_mdl(f_icst, cause_pattern, consequent, guard_builder, period, new_cst)) {
                inject_hlps(analysis_starting_time);
            }
        }
    }
}